

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  pointer pdVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *in_00;
  ulong uVar3;
  size_type n;
  vector<double,_std::allocator<double>_> P_new;
  double p;
  delim_c local_99;
  ulong local_98;
  undefined4 local_8c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_88;
  iterator iStack_80;
  double *local_78;
  param_type local_68;
  double local_38;
  
  local_88._M_current = (double *)0x0;
  iStack_80._M_current = (double *)0x0;
  local_78 = (double *)0x0;
  local_8c = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_68.P_.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,0x28);
  pbVar2 = utility::operator>>(in,(delim_c *)&local_68);
  in_00 = std::istream::_M_extract<unsigned_long>((ulong *)pbVar2);
  local_99.c = ' ';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_00,&local_99);
  if (local_98 != 0) {
    uVar3 = 0;
    do {
      std::istream::_M_extract<double>((double *)in);
      uVar3 = uVar3 + 1;
      if (uVar3 < local_98) {
        local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_68.P_.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
        utility::operator>>(in,(delim_c *)&local_68);
      }
      if (iStack_80._M_current == local_78) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_88,iStack_80,&local_38);
      }
      else {
        *iStack_80._M_current = local_38;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
    } while (uVar3 < local_98);
  }
  local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_68.P_.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,0x29);
  utility::operator>>(in,(delim_c *)&local_68);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    discrete_dist::param_type::
    param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (&local_68,local_88,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               iStack_80._M_current);
    pdVar1 = (P->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    (P->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    (P->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (P->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pdVar1 != (pointer)0x0) {
      operator_delete(pdVar1);
    }
    P->offset_ = local_68.offset_;
    P->N_ = local_68.N_;
    P->layers_ = local_68.layers_;
    if (local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = local_8c;
  if (local_88._M_current != (double *)0x0) {
    operator_delete(local_88._M_current);
  }
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(std::basic_istream<char_t, traits_t> &in,
                                                   discrete_dist::param_type &P) {
    double p;
    std::vector<double>::size_type n;
    std::vector<double> P_new;
    std::ios_base::fmtflags flags(in.flags());
    in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    in >> utility::delim('(') >> n >> utility::delim(' ');
    for (std::vector<double>::size_type i{0}; i < n; ++i) {
      in >> p;
      if (i + 1 < n)
        in >> utility::delim(' ');
      P_new.push_back(p);
    }
    in >> utility::delim(')');
    if (in)
      P = discrete_dist::param_type(P_new.begin(), P_new.end());
    in.flags(flags);
    return in;
  }